

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_builder.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::GenerateBuildPartial
          (MessageBuilderGenerator *this,Printer *printer)

{
  int iVar1;
  OneofDescriptor *oneof;
  bool bVar2;
  uint uVar3;
  FieldDescriptor *pFVar4;
  ImmutableFieldGenerator *pIVar5;
  reference ppVar6;
  OneofGeneratorInfo *args_1;
  Descriptor *pDVar7;
  int index;
  ulong uVar8;
  AlphaNum *a;
  ulong extraout_RDX;
  int i;
  int iVar9;
  uint uVar10;
  int i_1;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  iterator iVar11;
  AlphaNum local_a0;
  string local_70;
  string local_50;
  
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&local_a0,this->name_resolver_,this->descriptor_);
  text._M_str = 
  "@java.lang.Override\npublic $classname$ buildPartial() {\n  $classname$ result = new $classname$(this);\n"
  ;
  text._M_len = 0x66;
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,text,(char (*) [10])0x475c54,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  iVar9 = 0;
  do {
    index = iVar9;
    iVar1 = this->descriptor_->field_count_;
    iVar9 = iVar1;
    if (iVar1 <= index) goto LAB_00230d62;
    pFVar4 = Descriptor::field(this->descriptor_,index);
    bVar2 = anon_unknown_16::BitfieldTracksMutability(pFVar4);
    iVar9 = index + 1;
  } while (!bVar2);
  text_00._M_str = "buildPartialRepeatedFields(result);\n";
  text_00._M_len = 0x24;
  io::Printer::Print<>(printer,text_00);
  iVar9 = this->descriptor_->field_count_;
LAB_00230d62:
  uVar3 = (iVar9 + 0x1f) / 0x20;
  uVar8 = (long)(iVar9 + 0x1f) % 0x20 & 0xffffffff;
  if (0 < iVar9) {
    for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
      GetBitFieldName_abi_cxx11_(&local_70,(java *)(ulong)uVar10,(int)uVar8);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_a0,uVar10);
      absl::lts_20250127::StrCat_abi_cxx11_(&local_50,(lts_20250127 *)&local_a0,a);
      text_01._M_str = "if ($bit_field_name$ != 0) { buildPartial$piece$(result); }\n";
      text_01._M_len = 0x3c;
      io::Printer::Print<char[15],std::__cxx11::string,char[6],std::__cxx11::string>
                (printer,text_01,(char (*) [15])"bit_field_name",&local_70,(char (*) [6])"piece",
                 &local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      uVar8 = extraout_RDX;
    }
  }
  if ((this->oneofs_).
      super_btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
      .
      super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
      .
      super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
      .tree_.size_ != 0) {
    text_02._M_str = "buildPartialOneofs(result);\n";
    text_02._M_len = 0x1c;
    io::Printer::Print<>(printer,text_02);
  }
  io::Printer::Outdent(printer);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&local_a0,this->name_resolver_,this->descriptor_);
  text_03._M_str = "  onBuilt();\n  return result;\n}\n\n";
  text_03._M_len = 0x21;
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,text_03,(char (*) [10])0x475c54,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  if (index < iVar1) {
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              ((string *)&local_a0,this->name_resolver_,this->descriptor_);
    text_04._M_str = "private void buildPartialRepeatedFields($classname$ result) {\n";
    text_04._M_len = 0x3e;
    io::Printer::Print<char[10],std::__cxx11::string>
              (printer,text_04,(char (*) [10])0x475c54,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
    for (iVar9 = 0; iVar9 < this->descriptor_->field_count_; iVar9 = iVar9 + 1) {
      pFVar4 = Descriptor::field(this->descriptor_,iVar9);
      bVar2 = anon_unknown_16::BitfieldTracksMutability(pFVar4);
      if (bVar2) {
        pFVar4 = Descriptor::field(this->descriptor_,iVar9);
        pIVar5 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                           (&this->field_generators_,pFVar4);
        (*(pIVar5->super_FieldGenerator)._vptr_FieldGenerator[0xd])(pIVar5,printer);
      }
    }
    io::Printer::Outdent(printer);
    text_05._M_str = "}\n\n";
    text_05._M_len = 3;
    io::Printer::Print<>(printer,text_05);
  }
  uVar10 = 0;
  if ((int)uVar3 < 1) {
    uVar3 = 0;
  }
  iVar9 = 0;
  for (; uVar3 != uVar10; uVar10 = uVar10 + 1) {
    iVar9 = GenerateBuildPartialPiece(this,printer,uVar10,iVar9);
  }
  if ((this->oneofs_).
      super_btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
      .
      super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
      .
      super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
      .tree_.size_ != 0) {
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              ((string *)&local_a0,this->name_resolver_,this->descriptor_);
    text_06._M_str = "private void buildPartialOneofs($classname$ result) {\n";
    text_06._M_len = 0x36;
    io::Printer::Print<char[10],std::__cxx11::string>
              (printer,text_06,(char (*) [10])0x475c54,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
    iVar11 = absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
             ::begin((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                      *)&this->oneofs_);
    local_a0.piece_._M_len = (size_t)iVar11.node_;
    local_a0.piece_._M_str._0_4_ = iVar11.position_;
    iVar11 = absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
             ::end((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                    *)&this->oneofs_);
    local_70._M_dataplus._M_p = (pointer)iVar11.node_;
    local_70._M_string_length._0_4_ = iVar11.position_;
    while (bVar2 = absl::lts_20250127::container_internal::
                   btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                   ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                                 *)&local_a0,(iterator *)&local_70), bVar2) {
      ppVar6 = absl::lts_20250127::container_internal::
               btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
               ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                            *)&local_a0);
      oneof = ppVar6->second;
      args_1 = Context::GetOneofGeneratorInfo(this->context_,oneof);
      text_07._M_str =
           "result.$oneof_name$Case_ = $oneof_name$Case_;\nresult.$oneof_name$_ = this.$oneof_name$_;\n"
      ;
      text_07._M_len = 0x59;
      io::Printer::Print<char[11],std::__cxx11::string>
                (printer,text_07,(char (*) [11])0x4e46f3,&args_1->name);
      for (iVar9 = 0; iVar9 < oneof->field_count_; iVar9 = iVar9 + 1) {
        pFVar4 = OneofDescriptor::field(oneof,iVar9);
        pDVar7 = FieldDescriptor::message_type(pFVar4);
        if (pDVar7 != (Descriptor *)0x0) {
          pFVar4 = OneofDescriptor::field(oneof,iVar9);
          pIVar5 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                             (&this->field_generators_,pFVar4);
          (*(pIVar5->super_FieldGenerator)._vptr_FieldGenerator[0xd])(pIVar5,printer);
        }
      }
      absl::lts_20250127::container_internal::
      btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
      ::increment((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                   *)&local_a0);
    }
    io::Printer::Outdent(printer);
    text_08._M_str = "}\n\n";
    text_08._M_len = 3;
    io::Printer::Print<>(printer,text_08);
  }
  return;
}

Assistant:

void MessageBuilderGenerator::GenerateBuildPartial(io::Printer* printer) {
  printer->Print(
      "@java.lang.Override\n"
      "public $classname$ buildPartial() {\n"
      "  $classname$ result = new $classname$(this);\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Indent();

  // Handle the repeated fields first so that the "mutable bits" are cleared.
  bool has_repeated_fields = false;
  for (int i = 0; i < descriptor_->field_count(); ++i) {
    if (BitfieldTracksMutability(descriptor_->field(i))) {
      has_repeated_fields = true;
      printer->Print("buildPartialRepeatedFields(result);\n");
      break;
    }
  }

  // One buildPartial#() per from_bit_field
  int totalBuilderInts = (descriptor_->field_count() + 31) / 32;
  if (totalBuilderInts > 0) {
    for (int i = 0; i < totalBuilderInts; ++i) {
      printer->Print(
          "if ($bit_field_name$ != 0) { buildPartial$piece$(result); }\n",
          "bit_field_name", GetBitFieldName(i), "piece", absl::StrCat(i));
    }
  }

  if (!oneofs_.empty()) {
    printer->Print("buildPartialOneofs(result);\n");
  }

  printer->Outdent();
  printer->Print(
      "  onBuilt();\n"
      "  return result;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // Build Repeated Fields
  if (has_repeated_fields) {
    printer->Print(
        "private void buildPartialRepeatedFields($classname$ result) {\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_));
    printer->Indent();
    for (int i = 0; i < descriptor_->field_count(); ++i) {
      if (BitfieldTracksMutability(descriptor_->field(i))) {
        const ImmutableFieldGenerator& field =
            field_generators_.get(descriptor_->field(i));
        field.GenerateBuildingCode(printer);
      }
    }
    printer->Outdent();
    printer->Print("}\n\n");
  }

  // Build non-oneof fields
  int start_field = 0;
  for (int i = 0; i < totalBuilderInts; i++) {
    start_field = GenerateBuildPartialPiece(printer, i, start_field);
  }

  // Build Oneofs
  if (!oneofs_.empty()) {
    printer->Print("private void buildPartialOneofs($classname$ result) {\n",
                   "classname",
                   name_resolver_->GetImmutableClassName(descriptor_));
    printer->Indent();
    for (auto& kv : oneofs_) {
      const OneofDescriptor* oneof = kv.second;
      printer->Print(
          "result.$oneof_name$Case_ = $oneof_name$Case_;\n"
          "result.$oneof_name$_ = this.$oneof_name$_;\n",
          "oneof_name", context_->GetOneofGeneratorInfo(oneof)->name);
      for (int i = 0; i < oneof->field_count(); ++i) {
        if (oneof->field(i)->message_type() != nullptr) {
          const ImmutableFieldGenerator& field =
              field_generators_.get(oneof->field(i));
          field.GenerateBuildingCode(printer);
        }
      }
    }
    printer->Outdent();
    printer->Print("}\n\n");
  }
}